

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_sqlite3.c
# Opt level: O2

uint8_t mm_sql_read_uint8(void *db,char *sql)

{
  FILE *__stream;
  uint8_t uVar1;
  int iVar2;
  char *pcVar3;
  sqlite3_stmt *res;
  
  res = (sqlite3_stmt *)0x0;
  iVar2 = sqlite3_prepare_v2((sqlite3 *)db,sql,-1,&res,(char **)0x0);
  __stream = _stderr;
  if (iVar2 == 0) {
    sqlite3_step(res);
    iVar2 = sqlite3_column_int(res,0);
    uVar1 = (uint8_t)iVar2;
    sqlite3_finalize(res);
  }
  else {
    pcVar3 = sqlite3_errmsg((sqlite3 *)db);
    fprintf(__stream,"%s: Failed to prepare: \nSQL: \'%s\'\nError: %s","mm_sql_read_uint8",sql,
            pcVar3);
    uVar1 = 0xff;
  }
  return uVar1;
}

Assistant:

uint8_t mm_sql_read_uint8(void* db, const char* sql) {
    sqlite3_stmt* res = NULL;
    uint8_t val = 0;
    int rc = sqlite3_prepare_v2((sqlite3*)db, sql, -1, &res, 0);

    if (rc != SQLITE_OK) {
        fprintf(stderr, "%s: Failed to prepare: \nSQL: '%s'\nError: %s", __func__, sql, sqlite3_errmsg((sqlite3*)(db)));
        return 0xFF;
    }

    sqlite3_step(res);

    val = (uint8_t)sqlite3_column_int(res, 0);

    sqlite3_finalize(res);

    return (val);
}